

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O3

double * __thiscall
util::math::internal_vector::BasicVector<Vector2,_double,_2UL>::operator[]
          (BasicVector<Vector2,_double,_2UL> *this,int b)

{
  S2LogMessage SStack_18;
  
  if (b < 0) {
    S2LogMessage::S2LogMessage
              (&SStack_18,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/math/vector.h"
               ,0x54,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (SStack_18.stream_,"Check failed: (b) >= (0) ",0x19);
  }
  else {
    if ((uint)b < 2) {
      return (double *)(this + (ulong)(uint)b * 8);
    }
    S2LogMessage::S2LogMessage
              (&SStack_18,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/math/vector.h"
               ,0x55,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (SStack_18.stream_,"Check failed: (b) < (SIZE) ",0x1b);
  }
  abort();
}

Assistant:

T& operator[](int b) {
    S2_DCHECK_GE(b, 0);
    S2_DCHECK_LT(b, SIZE);
    return static_cast<D&>(*this).Data()[b];
  }